

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O0

int plock_unlock(plock *plock,plock_entry_t *plock_entry)

{
  undefined8 *in_RSI;
  list *in_RDI;
  plock_node *node;
  int local_4;
  
  if ((in_RDI == (list *)0x0) || (in_RSI == (undefined8 *)0x0)) {
    local_4 = -1;
  }
  else {
    (*(code *)in_RDI[2].head[2].next)(in_RDI[4].head);
    if (*(int *)(in_RSI + 3) == 0) {
      list_remove(in_RDI,(list_elem *)(in_RSI + 4));
      list_push_front(in_RDI + 1,(list_elem *)(in_RSI + 4));
    }
    (*(code *)in_RDI[2].head[1].prev)(*in_RSI);
    (*(code *)in_RDI[2].head[3].prev)(in_RDI[4].head);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int plock_unlock(struct plock *plock, plock_entry_t *plock_entry)
{
    struct plock_node *node = plock_entry;

    if (!plock || !plock_entry) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    // grab plock's lock
    plock->ops->lock_internal(plock->lock);

    if (node->wcount == 0) {
        // no other thread refers this node
        // move from active to inactive
        list_remove(&plock->active, &node->le);
        list_push_front(&plock->inactive, &node->le);
    }
    plock->ops->unlock_user(node->lock);

    // release plock's lock
    plock->ops->unlock_internal(plock->lock);

    return PLOCK_RESULT_SUCCESS;
}